

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O0

void end_pass(bfgs *b)

{
  bool bVar1;
  long *in_RDI;
  bfgs *in_stack_00000018;
  vw *in_stack_00000020;
  int status;
  vw *all;
  size_t *in_stack_ffffffffffffff80;
  vw *in_stack_ffffffffffffff88;
  string local_68 [48];
  string local_38 [36];
  int local_14;
  long local_10;
  long *local_8;
  
  local_10 = *in_RDI;
  if ((ulong)in_RDI[0x13] <= (ulong)in_RDI[3]) {
    if ((ulong)in_RDI[0x13] < (ulong)in_RDI[3]) {
      local_8 = in_RDI;
      local_14 = process_pass(in_stack_00000020,in_stack_00000018);
      if (local_8[3] == local_8[0x13]) {
        std::operator<<((ostream *)(*local_8 + 0xe0),"Maximum number of passes reached. ");
        if ((*(byte *)(local_8 + 0x17) & 1) == 0) {
          std::operator<<((ostream *)(*local_8 + 0xe0),
                          "If you want to optimize further, increase the number of passes\n");
        }
        if ((*(byte *)(local_8 + 0x17) & 1) != 0) {
          std::operator<<((ostream *)(*local_8 + 0xe0),"\nRegular model file has been created. ");
          std::operator<<((ostream *)(*local_8 + 0xe0),
                          "Output feature regularizer file is created only when the convergence is reached. Try increasing the number of passes for convergence\n"
                         );
          *(undefined1 *)(local_8 + 0x17) = 0;
        }
      }
      if ((local_14 == 0) || ((ulong)local_8[3] <= (ulong)local_8[0x13])) {
        zero_preconditioner((vw *)0x2810ce);
      }
      else {
        local_8[3] = local_8[0x13];
      }
      if ((*(byte *)(local_10 + 0x3457) & 1) == 0) {
        bVar1 = summarize_holdout_set(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
        if (bVar1) {
          std::__cxx11::string::string(local_38,(string *)(local_10 + 0x3570));
          finalize_regressor((vw *)b,(string *)all);
          std::__cxx11::string::~string(local_38);
        }
        if (local_8[0x15] == local_8[0x14]) {
          set_done((vw *)0x281183);
          std::operator<<((ostream *)(*local_8 + 0xe0),
                          "Early termination reached w.r.t. holdout set error");
        }
      }
      if (local_8[3] == local_8[0x13]) {
        std::__cxx11::string::string(local_68,(string *)(local_10 + 0x3570));
        finalize_regressor((vw *)b,(string *)all);
        std::__cxx11::string::~string(local_68);
        set_done((vw *)0x281203);
      }
    }
    else {
      in_RDI[0x13] = in_RDI[0x13] + 1;
    }
  }
  return;
}

Assistant:

void end_pass(bfgs& b)
{
  vw* all = b.all;

  if (b.current_pass <= b.final_pass)
  {
    if (b.current_pass < b.final_pass)
    {
      int status = process_pass(*all, b);

      // reaching the max number of passes regardless of convergence
      if (b.final_pass == b.current_pass)
      {
        b.all->trace_message << "Maximum number of passes reached. ";
        if (!b.output_regularizer)
          b.all->trace_message << "If you want to optimize further, increase the number of passes\n";
        if (b.output_regularizer)
        {
          b.all->trace_message << "\nRegular model file has been created. ";
          b.all->trace_message << "Output feature regularizer file is created only when the convergence is reached. "
                                  "Try increasing the number of passes for convergence\n";
          b.output_regularizer = false;
        }
      }

      // attain convergence before reaching max iterations
      if (status != LEARN_OK && b.final_pass > b.current_pass)
      {
        b.final_pass = b.current_pass;
      }
      else
      {
        // Not converged yet.
        // Reset preconditioner to zero so that it is correctly recomputed in the next pass
        zero_preconditioner(*all);
      }
      if (!all->holdout_set_off)
      {
        if (summarize_holdout_set(*all, b.no_win_counter))
          finalize_regressor(*all, all->final_regressor_name);
        if (b.early_stop_thres == b.no_win_counter)
        {
          set_done(*all);
          b.all->trace_message << "Early termination reached w.r.t. holdout set error";
        }
      }
      if (b.final_pass == b.current_pass)
      {
        finalize_regressor(*all, all->final_regressor_name);
        set_done(*all);
      }
    }
    else  // reaching convergence in the previous pass
      b.current_pass++;
  }
}